

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O2

void duckdb::RemapStructFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  reference input;
  reference default_vector;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  input = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  default_vector = vector<duckdb::Vector,_true>::get<true>(&args->data,3);
  RemapStruct(input,default_vector,result,args->count,
              (vector<duckdb::RemapColumnInfo,_true> *)(pFVar3 + 1));
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  Vector::Verify(result,args->count);
  return;
}

Assistant:

static void RemapStructFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RemapStructBindData>();

	auto &input = args.data[0];

	RemapStruct(input, args.data[3], result, args.size(), info.remap_info);
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(args.size());
}